

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::pack_data_models(crn_comp *this)

{
  uint uVar1;
  vector<unsigned_char> *other;
  uint local_c4;
  uint i;
  undefined1 local_b0 [8];
  symbol_codec codec;
  crn_comp *this_local;
  
  codec._144_8_ = this;
  symbol_codec::symbol_codec((symbol_codec *)local_b0);
  symbol_codec::start_encoding((symbol_codec *)local_b0,0x100000);
  uVar1 = symbol_codec::encode_transmit_static_huffman_data_model
                    ((symbol_codec *)local_b0,&this->m_reference_dm,false,
                     (static_huffman_data_model *)0x0);
  if (uVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    for (local_c4 = 0; local_c4 < 2; local_c4 = local_c4 + 1) {
      uVar1 = static_huffman_data_model::get_total_syms
                        ((static_huffman_data_model *)
                         ((long)this->m_endpoint_index_hist + (ulong)local_c4 * 0x38 + 0x20));
      if ((uVar1 != 0) &&
         (uVar1 = symbol_codec::encode_transmit_static_huffman_data_model
                            ((symbol_codec *)local_b0,
                             (static_huffman_data_model *)
                             ((long)this->m_endpoint_index_hist + (ulong)local_c4 * 0x38 + 0x20),
                             false,(static_huffman_data_model *)0x0), uVar1 == 0)) {
        this_local._7_1_ = false;
        goto LAB_001aa861;
      }
      uVar1 = static_huffman_data_model::get_total_syms
                        ((static_huffman_data_model *)
                         ((long)this->m_selector_index_hist + (ulong)local_c4 * 0x38 + 0x20));
      if ((uVar1 != 0) &&
         (uVar1 = symbol_codec::encode_transmit_static_huffman_data_model
                            ((symbol_codec *)local_b0,
                             (static_huffman_data_model *)
                             ((long)this->m_selector_index_hist + (ulong)local_c4 * 0x38 + 0x20),
                             false,(static_huffman_data_model *)0x0), uVar1 == 0)) {
        this_local._7_1_ = false;
        goto LAB_001aa861;
      }
    }
    symbol_codec::stop_encoding((symbol_codec *)local_b0,false);
    other = symbol_codec::get_encoding_buf((symbol_codec *)local_b0);
    vector<unsigned_char>::swap(&this->m_packed_data_models,other);
    this_local._7_1_ = true;
  }
LAB_001aa861:
  symbol_codec::~symbol_codec((symbol_codec *)local_b0);
  return this_local._7_1_;
}

Assistant:

bool crn_comp::pack_data_models() {
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);

  if (!codec.encode_transmit_static_huffman_data_model(m_reference_dm, false))
    return false;

  for (uint i = 0; i < 2; i++) {
    if (m_endpoint_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_endpoint_index_dm[i], false))
        return false;
    }

    if (m_selector_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_selector_index_dm[i], false))
        return false;
    }
  }

  codec.stop_encoding(false);

  m_packed_data_models.swap(codec.get_encoding_buf());

  return true;
}